

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_tonum(jit_State *J,TRef tr)

{
  TRef in_ESI;
  jit_State *in_RDI;
  TraceError in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  if ((in_ESI & 0x1f000000) != 0xe000000) {
    if ((in_ESI >> 0x18 & 0x1f) - 0xf < 5) {
      (in_RDI->fold).ins.field_0.ot = 0x590e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
      (in_RDI->fold).ins.field_0.op2 = 0x1d3;
      in_ESI = lj_opt_fold(in_RDI);
    }
    else {
      if ((in_ESI & 0x1f000000) != 0x4000000) {
        lj_trace_err((jit_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
      }
      (in_RDI->fold).ins.field_0.ot = 0x5c8e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
      (in_RDI->fold).ins.field_0.op2 = 0;
      in_ESI = lj_opt_fold(in_RDI);
    }
  }
  return in_ESI;
}

Assistant:

TRef LJ_FASTCALL lj_ir_tonum(jit_State *J, TRef tr)
{
  if (!tref_isnum(tr)) {
    if (tref_isinteger(tr))
      tr = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
    else if (tref_isstr(tr))
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    else
      lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  return tr;
}